

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

char * fy_node_get_tag(fy_node *fyn,size_t *lenp)

{
  char *pcVar1;
  size_t *lenp_00;
  size_t tmplen;
  size_t sStack_8;
  
  lenp_00 = &sStack_8;
  if (lenp != (size_t *)0x0) {
    lenp_00 = lenp;
  }
  if ((fyn == (fy_node *)0x0) || (fyn->tag == (fy_token *)0x0)) {
    *lenp_00 = 0;
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = fy_token_get_text(fyn->tag,lenp_00);
  }
  return pcVar1;
}

Assistant:

const char *fy_node_get_tag(struct fy_node *fyn, size_t *lenp) {
    size_t tmplen;

    if (!lenp)
        lenp = &tmplen;

    if (!fyn || !fyn->tag) {
        *lenp = 0;
        return NULL;
    }

    return fy_token_get_text(fyn->tag, lenp);
}